

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int stat4ValueFromExpr(Parse *pParse,Expr *pExpr,u8 affinity,ValueNewStat4Ctx *pAlloc,
                      sqlite3_value **ppVal)

{
  u32 *puVar1;
  undefined2 uVar2;
  sqlite3 *db;
  Vdbe *pVVar3;
  int iVar4;
  Expr *pExpr_00;
  sqlite3_value *pMem;
  uint uVar5;
  sqlite3_value *local_38;
  
  local_38 = (sqlite3_value *)0x0;
  db = pParse->db;
  pExpr_00 = sqlite3ExprSkipCollate(pExpr);
  if (pExpr_00 == (Expr *)0x0) {
    pMem = valueNew(db,pAlloc);
    iVar4 = 0;
    if (pMem == (sqlite3_value *)0x0) {
      pMem = (sqlite3_value *)0x0;
    }
    else {
      sqlite3VdbeMemSetNull(pMem);
    }
  }
  else if ((pExpr_00->op == 0x94) && ((db->flags & 0x800000) == 0)) {
    uVar2 = pExpr_00->iColumn;
    uVar5 = 0x80000000;
    if ((short)uVar2 < 0x20) {
      uVar5 = 1 << ((char)uVar2 - 1U & 0x1f);
    }
    puVar1 = &pParse->pVdbe->expmask;
    *puVar1 = *puVar1 | uVar5;
    pVVar3 = pParse->pReprepare;
    if (pVVar3 != (Vdbe *)0x0) {
      pMem = valueNew(db,pAlloc);
      if (pMem != (sqlite3_value *)0x0) {
        iVar4 = sqlite3VdbeMemCopy(pMem,pVVar3->aVar + (long)(short)uVar2 + -1);
        applyAffinity(pMem,affinity,db->enc);
        pMem->db = pParse->db;
        goto LAB_0018d4aa;
      }
    }
    iVar4 = 0;
    pMem = (sqlite3_value *)0x0;
  }
  else {
    iVar4 = valueFromExpr(db,pExpr_00,db->enc,affinity,&local_38,pAlloc);
    pMem = local_38;
  }
LAB_0018d4aa:
  *ppVal = pMem;
  return iVar4;
}

Assistant:

static int stat4ValueFromExpr(
  Parse *pParse,                  /* Parse context */
  Expr *pExpr,                    /* The expression to extract a value from */
  u8 affinity,                    /* Affinity to use */
  struct ValueNewStat4Ctx *pAlloc,/* How to allocate space.  Or NULL */
  sqlite3_value **ppVal           /* OUT: New value object (or NULL) */
){
  int rc = SQLITE_OK;
  sqlite3_value *pVal = 0;
  sqlite3 *db = pParse->db;

  /* Skip over any TK_COLLATE nodes */
  pExpr = sqlite3ExprSkipCollate(pExpr);

  assert( pExpr==0 || pExpr->op!=TK_REGISTER || pExpr->op2!=TK_VARIABLE );
  if( !pExpr ){
    pVal = valueNew(db, pAlloc);
    if( pVal ){
      sqlite3VdbeMemSetNull((Mem*)pVal);
    }
  }else if( pExpr->op==TK_VARIABLE && (db->flags & SQLITE_EnableQPSG)==0 ){
    Vdbe *v;
    int iBindVar = pExpr->iColumn;
    sqlite3VdbeSetVarmask(pParse->pVdbe, iBindVar);
    if( (v = pParse->pReprepare)!=0 ){
      pVal = valueNew(db, pAlloc);
      if( pVal ){
        rc = sqlite3VdbeMemCopy((Mem*)pVal, &v->aVar[iBindVar-1]);
        sqlite3ValueApplyAffinity(pVal, affinity, ENC(db));
        pVal->db = pParse->db;
      }
    }
  }else{
    rc = valueFromExpr(db, pExpr, ENC(db), affinity, &pVal, pAlloc);
  }

  assert( pVal==0 || pVal->db==db );
  *ppVal = pVal;
  return rc;
}